

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

void base64_encode(char *src,size_t srclen,char *out,size_t *outlen,int flags)

{
  long lVar1;
  uint8_t *puVar2;
  base64_state state;
  size_t s;
  base64_state local_48;
  size_t local_38;
  
  if (((char)flags != '\0') ||
     (codec.enc == (_func_void_base64_state_ptr_char_ptr_size_t_char_ptr_size_t_ptr *)0x0)) {
    codec_choose(&codec,flags);
  }
  local_48.eof = 0;
  local_48.bytes = 0;
  local_48.carry = 0;
  local_48.flags = flags;
  (*codec.enc)(&local_48,src,srclen,out,&local_38);
  puVar2 = (uint8_t *)(out + local_38);
  if (local_48.bytes == 2) {
    *puVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[local_48.carry];
    puVar2 = puVar2 + 1;
    lVar1 = 2;
  }
  else {
    if (local_48.bytes != 1) {
      lVar1 = 0;
      goto LAB_001027e4;
    }
    *puVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[local_48.carry];
    puVar2[1] = '=';
    puVar2 = puVar2 + 2;
    lVar1 = 3;
  }
  *puVar2 = '=';
LAB_001027e4:
  *outlen = lVar1 + local_38;
  return;
}

Assistant:

void
base64_encode
	( const char	*src
	, size_t	 srclen
	, char		*out
	, size_t	*outlen
	, int		 flags
	)
{
	size_t s;
	size_t t;
	struct base64_state state;

	#ifdef _OPENMP
	if (srclen >= OMP_THRESHOLD) {
		base64_encode_openmp(src, srclen, out, outlen, flags);
		return;
	}
	#endif

	// Init the stream reader:
	base64_stream_encode_init(&state, flags);

	// Feed the whole string to the stream reader:
	base64_stream_encode(&state, src, srclen, out, &s);

	// Finalize the stream by writing trailer if any:
	base64_stream_encode_final(&state, out + s, &t);

	// Final output length is stream length plus tail:
	*outlen = s + t;
}